

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBreak(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  FunctionCreationContext *pFVar2;
  pointer ppEVar3;
  bool bVar4;
  uint32_t uVar5;
  value_type *ppEVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  uint uVar9;
  uintptr_t uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  TranslateToFuzzReader *this_00;
  Expression EVar14;
  Expression *local_48;
  Expression *local_40;
  TranslateToFuzzReader *local_38;
  
  pFVar2 = this->funcContext;
  if ((pFVar2->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pFVar2->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar8 = makeTrivial(this,type);
    return pEVar8;
  }
  if (type.id == 1) {
    local_40 = (Expression *)0x0;
  }
  else {
    local_48 = (Expression *)0x0;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pFVar2->hangStack,
               &local_48);
    local_40 = makeCondition(this);
  }
  iVar12 = (this->fuzzParams->super_FuzzParams).TRIES;
  if (0 < iVar12) {
    local_38 = (TranslateToFuzzReader *)&this->random;
    do {
      this_00 = local_38;
      ppEVar6 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)local_38,&this->funcContext->breakableStack);
      pEVar8 = *ppEVar6;
      EVar14 = (Expression)getTargetName(this_00,pEVar8);
      if (pEVar8->_id == LoopId) {
        uVar10 = 0;
      }
      else {
        if (pEVar8->_id != BlockId) {
          wasm::handle_unreachable
                    ("unexpected expr type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0x15f4);
        }
        uVar10 = (pEVar8->type).id;
      }
      if (type.id < 2) {
        if (type.id == 0) {
          if (uVar10 == 0) {
            pEVar8 = (Expression *)
                     MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x30,8);
            pEVar8->_id = BreakId;
            (pEVar8->type).id = 1;
            pEVar8[1] = EVar14;
            *(undefined8 *)(pEVar8 + 2) = 0;
            goto LAB_0012e4fe;
          }
        }
        else if (uVar10 == 0) {
          ppEVar3 = (this->funcContext->hangStack).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar9 = (uint)((ulong)((long)(this->funcContext->hangStack).
                                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3)
                        >> 3);
          if ((int)uVar9 < 1) {
LAB_0012e3ff:
            uVar5 = 4;
          }
          else {
            uVar11 = (ulong)(uVar9 & 0x7fffffff) + 1;
            lVar13 = 0;
            do {
              pEVar8 = ppEVar3[uVar11 - 2];
              if (pEVar8 == (Expression *)0x0) {
                lVar13 = lVar13 + 1;
              }
              else {
                if (pEVar8->_id != LoopId) {
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Loop]");
                }
                if (pEVar8[1].type.id == EVar14.type.id.id) break;
              }
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            if (lVar13 != 1) {
              if (lVar13 != 0) {
                uVar5 = Random::upTo((Random *)local_38,(int)lVar13 + 1);
                if (uVar5 != 0) goto LAB_0012e52c;
                goto LAB_0012e44d;
              }
              goto LAB_0012e3ff;
            }
            uVar5 = 2;
          }
          uVar5 = Random::upTo((Random *)local_38,uVar5);
          if (uVar5 == 0) {
LAB_0012e52c:
            pEVar8 = (Expression *)
                     MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x30,8);
            pEVar8->_id = BreakId;
            (pEVar8->type).id = 1;
            pEVar8[1] = EVar14;
            *(undefined8 *)(pEVar8 + 2) = 0;
            pEVar8[2].type.id = 0;
            wasm::Break::finalize();
            return pEVar8;
          }
        }
      }
      else if (uVar10 == type.id) {
        pEVar7 = make(this,type);
        pEVar8 = (Expression *)
                 MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x30,8);
        pEVar8->_id = BreakId;
        (pEVar8->type).id = 1;
        pEVar8[1] = EVar14;
        *(Expression **)(pEVar8 + 2) = pEVar7;
LAB_0012e4fe:
        pEVar8[2].type.id = (uintptr_t)local_40;
        wasm::Break::finalize();
        pppEVar1 = &(this->funcContext->hangStack).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + -1;
        return pEVar8;
      }
LAB_0012e44d:
      bVar4 = 1 < iVar12;
      iVar12 = iVar12 + -1;
    } while (bVar4);
  }
  if (type.id != 1) {
    pppEVar1 = &(this->funcContext->hangStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + -1;
  }
  pEVar8 = makeTrivial(this,type);
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeBreak(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  Expression* condition = nullptr;
  if (type != Type::unreachable) {
    funcContext->hangStack.push_back(nullptr);
    condition = makeCondition();
  }
  // we need to find a proper target to break to; try a few times
  int tries = fuzzParams->TRIES;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto valueType = getTargetType(target);
    if (type.isConcrete()) {
      // we are flowing out a value
      if (valueType != type) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, make(type), condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else if (type == Type::none) {
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, nullptr, condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else {
      assert(type == Type::unreachable);
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      // we are about to make an *un*conditional break. if it is
      // to a loop, we prefer there to be a condition along the
      // way, to reduce the chance of infinite looping
      size_t conditions = 0;
      int i = funcContext->hangStack.size();
      while (--i >= 0) {
        auto* item = funcContext->hangStack[i];
        if (item == nullptr) {
          conditions++;
        } else if (auto* loop = item->cast<Loop>()) {
          if (loop->name == name) {
            // we found the target, no more conditions matter
            break;
          }
        }
      }
      switch (conditions) {
        case 0: {
          if (!oneIn(4)) {
            continue;
          }
          break;
        }
        case 1: {
          if (!oneIn(2)) {
            continue;
          }
          break;
        }
        default: {
          if (oneIn(conditions + 1)) {
            continue;
          }
        }
      }
      return builder.makeBreak(name);
    }
  }
  // we failed to find something
  if (type != Type::unreachable) {
    funcContext->hangStack.pop_back();
  }
  return makeTrivial(type);
}